

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlValidatePopElement(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  xmlChar *qname;
  PyObject *pyobj_elem;
  PyObject *pyobj_doc;
  PyObject *pyobj_ctxt;
  undefined8 local_30;
  undefined *local_28;
  undefined *local_20;
  undefined *local_18;
  
  iVar1 = libxml_deprecationWarning("xmlValidatePopElement");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT
                      (args,"OOOz:xmlValidatePopElement",&local_18,&local_20,&local_28,&local_30);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(local_18 + 0x10);
      }
      if (local_20 == &_Py_NoneStruct) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(local_20 + 0x10);
      }
      if (local_28 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_28 + 0x10);
      }
      iVar1 = xmlValidatePopElement(uVar5,uVar4,uVar3,local_30);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidatePopElement(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * qname;

    if (libxml_deprecationWarning("xmlValidatePopElement") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOz:xmlValidatePopElement", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &qname))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = xmlValidatePopElement(ctxt, doc, elem, qname);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}